

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeBeginStmt(Btree *p,int iStatement)

{
  BtShared *pBVar1;
  int iVar2;
  BtShared *pBt;
  int rc;
  int iStatement_local;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  iVar2 = sqlite3PagerOpenSavepoint(pBVar1->pPager,iStatement);
  sqlite3BtreeLeave(p);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginStmt(Btree *p, int iStatement){
  int rc;
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( iStatement>0 );
  assert( iStatement>p->db->nSavepoint );
  assert( pBt->inTransaction==TRANS_WRITE );
  /* At the pager level, a statement transaction is a savepoint with
  ** an index greater than all savepoints created explicitly using
  ** SQL statements. It is illegal to open, release or rollback any
  ** such savepoints while the statement transaction savepoint is active.
  */
  rc = sqlite3PagerOpenSavepoint(pBt->pPager, iStatement);
  sqlite3BtreeLeave(p);
  return rc;
}